

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

void __thiscall ALCcontext::allocVoices(ALCcontext *this,size_t addcount)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *this_00;
  vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
  *this_01;
  pointer pFVar4;
  type pVVar5;
  atomic<al::FlexArray<Voice_*,_8UL>_*> *this_02;
  __pointer_type pFVar6;
  long in_RSI;
  long in_RDI;
  FlexArray<Voice_*,_8UL> *oldvoices;
  size_t i;
  VoiceCluster *cluster;
  iterator __end1;
  iterator __begin1;
  vector<VoiceCluster> *__range1;
  iterator voice_iter;
  unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
  newarray;
  size_t totalcount;
  size_t clustersize;
  vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
  *in_stack_ffffffffffffff50;
  unique_ptr<Voice[],_std::default_delete<Voice[]>_> *in_stack_ffffffffffffff58;
  ALCdevice *in_stack_ffffffffffffff68;
  index_type in_stack_ffffffffffffff88;
  ulong local_70;
  __normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
  in_stack_ffffffffffffffa8;
  iterator local_48;
  ulong local_10;
  
  local_10 = in_RSI + 0x1fU >> 5;
  iVar2 = std::numeric_limits<int>::max();
  sVar3 = std::
          vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
          ::size((vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                  *)(in_RDI + 0x140));
  if (local_10 < ((ulong)(long)iVar2 >> 5) - sVar3) {
    sVar3 = std::
            vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
            ::size((vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                    *)(in_RDI + 0x140));
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Increasing allocated voices to %zu\n",
              (sVar3 + local_10) * 0x20);
    }
    al::FlexArray<Voice_*,_8UL>::Create(in_stack_ffffffffffffff88);
    for (; local_10 != 0; local_10 = local_10 - 1) {
      this_01 = (vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
                 *)(in_RDI + 0x140);
      std::make_unique<Voice[]>((size_t)in_stack_ffffffffffffffa8._M_current);
      std::
      vector<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,al::allocator<std::unique_ptr<Voice[],std::default_delete<Voice[]>>,8ul>>
      ::emplace_back<std::unique_ptr<Voice[],std::default_delete<Voice[]>>>
                (this_01,in_stack_ffffffffffffff58);
      std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>::~unique_ptr
                ((unique_ptr<Voice[],_std::default_delete<Voice[]>_> *)in_stack_ffffffffffffff50);
    }
    pFVar4 = std::
             unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
             ::operator->((unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                           *)0x17e4c0);
    local_48 = al::FlexArray<Voice_*,_8UL>::begin(pFVar4);
    std::
    vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
    ::begin(in_stack_ffffffffffffff48);
    std::
    vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>
    ::end(in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff50,
                              (__normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
                               *)in_stack_ffffffffffffff48), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
      ::operator*((__normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
                   *)&stack0xffffffffffffffa8);
      for (local_70 = 0; local_70 < 0x20; local_70 = local_70 + 1) {
        pVVar5 = std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>::operator[]
                           ((unique_ptr<Voice[],_std::default_delete<Voice[]>_> *)
                            in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        *local_48 = pVVar5;
        local_48 = local_48 + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
      ::operator++((__normal_iterator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>_*,_std::vector<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_al::allocator<std::unique_ptr<Voice[],_std::default_delete<Voice[]>_>,_8UL>_>_>
                    *)&stack0xffffffffffffffa8);
    }
    this_02 = (atomic<al::FlexArray<Voice_*,_8UL>_*> *)(in_RDI + 0x158);
    pFVar4 = std::
             unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
             ::release((unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                        *)0x17e5a0);
    pFVar6 = std::atomic<al::FlexArray<Voice_*,_8UL>_*>::exchange
                       (this_02,pFVar4,memory_order_acq_rel);
    if (pFVar6 != (__pointer_type)0x0) {
      al::intrusive_ptr<ALCdevice>::operator->((intrusive_ptr<ALCdevice> *)(in_RDI + 0x200));
      ALCdevice::waitForMix(in_stack_ffffffffffffff68);
      if (pFVar6 != (__pointer_type)0x0) {
        al::FlexArray<Voice_*,_8UL>::~FlexArray((FlexArray<Voice_*,_8UL> *)0x17e5f0);
        al::FlexArray<Voice*,8ul>::operator_delete((void *)0x17e5f9);
      }
    }
    std::unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
    ::~unique_ptr((unique_ptr<al::FlexArray<Voice_*,_8UL>,_std::default_delete<al::FlexArray<Voice_*,_8UL>_>_>
                   *)this_02);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Allocating too many voices");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ALCcontext::allocVoices(size_t addcount)
{
    constexpr size_t clustersize{32};
    /* Convert element count to cluster count. */
    addcount = (addcount+(clustersize-1)) / clustersize;

    if(addcount >= std::numeric_limits<int>::max()/clustersize - mVoiceClusters.size())
        throw std::runtime_error{"Allocating too many voices"};
    const size_t totalcount{(mVoiceClusters.size()+addcount) * clustersize};
    TRACE("Increasing allocated voices to %zu\n", totalcount);

    auto newarray = VoiceArray::Create(totalcount);
    while(addcount)
    {
        mVoiceClusters.emplace_back(std::make_unique<Voice[]>(clustersize));
        --addcount;
    }

    auto voice_iter = newarray->begin();
    for(VoiceCluster &cluster : mVoiceClusters)
    {
        for(size_t i{0};i < clustersize;++i)
            *(voice_iter++) = &cluster[i];
    }

    if(auto *oldvoices = mVoices.exchange(newarray.release(), std::memory_order_acq_rel))
    {
        mDevice->waitForMix();
        delete oldvoices;
    }
}